

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomUI::read(DomUI *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  QStringView other_02;
  QStringView other_03;
  QStringView other_04;
  QStringView other_05;
  QStringView other_06;
  QStringView other_07;
  QStringView other_08;
  QStringView other_09;
  QStringView other_10;
  QStringView other_11;
  QStringView other_12;
  QStringView other_13;
  QStringView other_14;
  QStringView other_15;
  QStringView other_16;
  bool bVar1;
  int iVar2;
  DomWidget *this_00;
  DomLayoutDefault *this_01;
  DomLayoutFunction *this_02;
  DomCustomWidgets *this_03;
  DomTabStops *this_04;
  DomIncludes *this_05;
  DomResources *this_06;
  DomConnections *this_07;
  size_t sVar3;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  undefined4 in_register_00000034;
  QStringBuilder<QLatin1String,_const_QStringView_&> *pQVar4;
  long in_FS_OFFSET;
  DomButtonGroups *v_10;
  DomSlots *v_9;
  DomDesignerData *v_8;
  DomConnections *v_7;
  DomResources *v_6;
  DomIncludes *v_5;
  DomTabStops *v_4;
  DomCustomWidgets *v_3;
  DomLayoutFunction *v_2;
  DomLayoutDefault *v_1;
  DomWidget *v;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  QStringBuilder<QLatin1String,_const_QStringView_&> *in_stack_fffffffffffff838;
  DomWidget *in_stack_fffffffffffff840;
  undefined7 in_stack_fffffffffffff848;
  byte in_stack_fffffffffffff84f;
  DomUI *in_stack_fffffffffffff850;
  undefined7 in_stack_fffffffffffff858;
  byte in_stack_fffffffffffff85f;
  DomDesignerData *in_stack_fffffffffffff860;
  undefined7 in_stack_fffffffffffff868;
  byte in_stack_fffffffffffff86f;
  char local_530 [152];
  undefined1 local_498 [184];
  undefined1 local_3e0 [64];
  undefined1 local_3a0 [64];
  undefined1 local_360 [104];
  undefined1 local_2f8 [64];
  undefined1 local_2b8 [16];
  QLatin1StringView local_2a8;
  QStringView local_268;
  QStringView local_230;
  QStringView local_1d0;
  QStringView local_170;
  QStringView local_138;
  QStringView local_e8;
  QStringView local_98;
  QStringView local_48;
  QXmlStreamAttribute *local_38;
  const_iterator local_30;
  const_iterator local_28 [4];
  long local_8;
  
  pQVar4 = (QStringBuilder<QLatin1String,_const_QStringView_&> *)CONCAT44(in_register_00000034,__fd)
  ;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffff840);
  local_30.i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_30 = QList<QXmlStreamAttribute>::end
                       ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffff840);
  while( true ) {
    local_38 = local_30.i;
    bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,local_30);
    if (!bVar1) break;
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    local_48.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
    local_48.m_size = 0xaaaaaaaaaaaaaaaa;
    local_48 = QXmlStreamAttribute::name((QXmlStreamAttribute *)0x19b0dd);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
               (size_t)in_stack_fffffffffffff850);
    QStringView::QStringView<QString,_true>
              ((QStringView *)in_stack_fffffffffffff850,
               (QString *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
    bVar1 = ::operator==((QStringView *)in_stack_fffffffffffff840,
                         (QStringView *)in_stack_fffffffffffff838);
    QString::~QString((QString *)0x19b144);
    if (bVar1) {
      local_98 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x19b15e);
      QStringView::toString((QStringView *)in_stack_fffffffffffff840);
      setAttributeVersion((DomUI *)in_stack_fffffffffffff840,(QString *)in_stack_fffffffffffff838);
      QString::~QString((QString *)0x19b1a5);
    }
    else {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                 (size_t)in_stack_fffffffffffff850);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_fffffffffffff850,
                 (QString *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
      bVar1 = ::operator==((QStringView *)in_stack_fffffffffffff840,
                           (QStringView *)in_stack_fffffffffffff838);
      QString::~QString((QString *)0x19b201);
      if (bVar1) {
        local_e8 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x19b21b);
        QStringView::toString((QStringView *)in_stack_fffffffffffff840);
        setAttributeLanguage
                  ((DomUI *)in_stack_fffffffffffff840,(QString *)in_stack_fffffffffffff838);
        QString::~QString((QString *)0x19b262);
      }
      else {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                   (size_t)in_stack_fffffffffffff850);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffff850,
                   (QString *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
        bVar1 = ::operator==((QStringView *)in_stack_fffffffffffff840,
                             (QStringView *)in_stack_fffffffffffff838);
        QString::~QString((QString *)0x19b2be);
        if (bVar1) {
          local_138 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x19b2d8);
          QStringView::toString((QStringView *)in_stack_fffffffffffff840);
          setAttributeDisplayname
                    ((DomUI *)in_stack_fffffffffffff840,(QString *)in_stack_fffffffffffff838);
          QString::~QString((QString *)0x19b31f);
        }
        else {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                     (size_t)in_stack_fffffffffffff850);
          QStringView::QStringView<QString,_true>
                    ((QStringView *)in_stack_fffffffffffff850,
                     (QString *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
          bVar1 = ::operator==((QStringView *)in_stack_fffffffffffff840,
                               (QStringView *)in_stack_fffffffffffff838);
          QString::~QString((QString *)0x19b37b);
          if (bVar1) {
            local_170 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x19b398);
            Qt::Literals::StringLiterals::operator____s
                      ((char16_t *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                       (size_t)in_stack_fffffffffffff850);
            QStringView::QStringView<QString,_true>
                      ((QStringView *)in_stack_fffffffffffff850,
                       (QString *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
            bVar1 = ::operator==((QStringView *)in_stack_fffffffffffff840,
                                 (QStringView *)in_stack_fffffffffffff838);
            setAttributeIdbasedtr(this,bVar1);
            QString::~QString((QString *)0x19b40b);
          }
          else {
            Qt::Literals::StringLiterals::operator____s
                      ((char16_t *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                       (size_t)in_stack_fffffffffffff850);
            QStringView::QStringView<QString,_true>
                      ((QStringView *)in_stack_fffffffffffff850,
                       (QString *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
            bVar1 = ::operator==((QStringView *)in_stack_fffffffffffff840,
                                 (QStringView *)in_stack_fffffffffffff838);
            QString::~QString((QString *)0x19b467);
            if (bVar1) {
              local_1d0 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x19b484);
              Qt::Literals::StringLiterals::operator____s
                        ((char16_t *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                         (size_t)in_stack_fffffffffffff850);
              QStringView::QStringView<QString,_true>
                        ((QStringView *)in_stack_fffffffffffff850,
                         (QString *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
              bVar1 = ::operator==((QStringView *)in_stack_fffffffffffff840,
                                   (QStringView *)in_stack_fffffffffffff838);
              setAttributeConnectslotsbyname(this,bVar1);
              QString::~QString((QString *)0x19b4f7);
            }
            else {
              Qt::Literals::StringLiterals::operator____s
                        ((char16_t *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                         (size_t)in_stack_fffffffffffff850);
              QStringView::QStringView<QString,_true>
                        ((QStringView *)in_stack_fffffffffffff850,
                         (QString *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
              bVar1 = ::operator==((QStringView *)in_stack_fffffffffffff840,
                                   (QStringView *)in_stack_fffffffffffff838);
              QString::~QString((QString *)0x19b553);
              if (bVar1) {
                local_230 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x19b56d);
                iVar2 = QStringView::toInt((QStringView *)
                                           CONCAT17(in_stack_fffffffffffff84f,
                                                    in_stack_fffffffffffff848),
                                           (bool *)in_stack_fffffffffffff840,
                                           (int)((ulong)in_stack_fffffffffffff838 >> 0x20));
                setAttributeStdsetdef(this,iVar2);
              }
              else {
                Qt::Literals::StringLiterals::operator____s
                          ((char16_t *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858)
                           ,(size_t)in_stack_fffffffffffff850);
                QStringView::QStringView<QString,_true>
                          ((QStringView *)in_stack_fffffffffffff850,
                           (QString *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848))
                ;
                bVar1 = ::operator==((QStringView *)in_stack_fffffffffffff840,
                                     (QStringView *)in_stack_fffffffffffff838);
                QString::~QString((QString *)0x19b5fe);
                if (bVar1) {
                  local_268 = QXmlStreamAttribute::value((QXmlStreamAttribute *)0x19b618);
                  iVar2 = QStringView::toInt((QStringView *)
                                             CONCAT17(in_stack_fffffffffffff84f,
                                                      in_stack_fffffffffffff848),
                                             (bool *)in_stack_fffffffffffff840,
                                             (int)((ulong)in_stack_fffffffffffff838 >> 0x20));
                  setAttributeStdSetDef(this,iVar2);
                }
                else {
                  local_2a8 = Qt::Literals::StringLiterals::operator____L1
                                        ((char *)CONCAT17(in_stack_fffffffffffff84f,
                                                          in_stack_fffffffffffff848),
                                         (size_t)in_stack_fffffffffffff840);
                  ::operator+((QLatin1String *)in_stack_fffffffffffff840,
                              (QStringView *)in_stack_fffffffffffff838);
                  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffff838);
                  QXmlStreamReader::raiseError((QString *)pQVar4);
                  QString::~QString((QString *)0x19b6d7);
                }
              }
            }
          }
        }
      }
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x19b6f8);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0019c623;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_2b8._0_8_ = 0xaaaaaaaaaaaaaaaa;
      local_2b8._8_8_ = 0xaaaaaaaaaaaaaaaa;
      local_2b8 = QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                 (size_t)in_stack_fffffffffffff850);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_fffffffffffff850,
                 (QString *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
      other.m_data._0_7_ = in_stack_fffffffffffff868;
      other.m_size = (qsizetype)in_stack_fffffffffffff860;
      other.m_data._7_1_ = in_stack_fffffffffffff86f;
      iVar2 = QStringView::compare((QStringView *)in_stack_fffffffffffff838,other,CaseInsensitive);
      QString::~QString((QString *)0x19b7d9);
      if (iVar2 == 0) {
        QXmlStreamReader::readElementText(local_2f8,pQVar4,0);
        setElementAuthor((DomUI *)in_stack_fffffffffffff840,(QString *)in_stack_fffffffffffff838);
        QString::~QString((QString *)0x19b81f);
      }
      else {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                   (size_t)in_stack_fffffffffffff850);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffff850,
                   (QString *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
        other_00.m_data._0_7_ = in_stack_fffffffffffff868;
        other_00.m_size = (qsizetype)in_stack_fffffffffffff860;
        other_00.m_data._7_1_ = in_stack_fffffffffffff86f;
        iVar2 = QStringView::compare
                          ((QStringView *)in_stack_fffffffffffff838,other_00,CaseInsensitive);
        bVar1 = true;
        if (iVar2 != 0) {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                     (size_t)in_stack_fffffffffffff850);
          QStringView::QStringView<QString,_true>
                    ((QStringView *)in_stack_fffffffffffff850,
                     (QString *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
          other_01.m_data._0_7_ = in_stack_fffffffffffff868;
          other_01.m_size = (qsizetype)in_stack_fffffffffffff860;
          other_01.m_data._7_1_ = in_stack_fffffffffffff86f;
          iVar2 = QStringView::compare
                            ((QStringView *)in_stack_fffffffffffff838,other_01,CaseInsensitive);
          bVar1 = iVar2 == 0;
          QString::~QString((QString *)0x19b914);
        }
        QString::~QString((QString *)0x19b921);
        if (bVar1) {
          QXmlStreamReader::readElementText(local_360,pQVar4,0);
          setElementComment((DomUI *)in_stack_fffffffffffff840,(QString *)in_stack_fffffffffffff838)
          ;
          QString::~QString((QString *)0x19b967);
        }
        else {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                     (size_t)in_stack_fffffffffffff850);
          QStringView::QStringView<QString,_true>
                    ((QStringView *)in_stack_fffffffffffff850,
                     (QString *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
          other_02.m_data._0_7_ = in_stack_fffffffffffff868;
          other_02.m_size = (qsizetype)in_stack_fffffffffffff860;
          other_02.m_data._7_1_ = in_stack_fffffffffffff86f;
          iVar2 = QStringView::compare
                            ((QStringView *)in_stack_fffffffffffff838,other_02,CaseInsensitive);
          QString::~QString((QString *)0x19b9d5);
          if (iVar2 == 0) {
            QXmlStreamReader::readElementText(local_3a0,pQVar4,0);
            setElementExportMacro
                      ((DomUI *)in_stack_fffffffffffff840,(QString *)in_stack_fffffffffffff838);
            QString::~QString((QString *)0x19ba1b);
          }
          else {
            Qt::Literals::StringLiterals::operator____s
                      ((char16_t *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                       (size_t)in_stack_fffffffffffff850);
            QStringView::QStringView<QString,_true>
                      ((QStringView *)in_stack_fffffffffffff850,
                       (QString *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
            other_03.m_data._0_7_ = in_stack_fffffffffffff868;
            other_03.m_size = (qsizetype)in_stack_fffffffffffff860;
            other_03.m_data._7_1_ = in_stack_fffffffffffff86f;
            iVar2 = QStringView::compare
                              ((QStringView *)in_stack_fffffffffffff838,other_03,CaseInsensitive);
            QString::~QString((QString *)0x19ba89);
            if (iVar2 == 0) {
              QXmlStreamReader::readElementText(local_3e0,pQVar4,0);
              setElementClass((DomUI *)in_stack_fffffffffffff840,
                              (QString *)in_stack_fffffffffffff838);
              QString::~QString((QString *)0x19bacf);
            }
            else {
              Qt::Literals::StringLiterals::operator____s
                        ((char16_t *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                         (size_t)in_stack_fffffffffffff850);
              QStringView::QStringView<QString,_true>
                        ((QStringView *)in_stack_fffffffffffff850,
                         (QString *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
              sVar3 = 0;
              other_04.m_data._0_7_ = in_stack_fffffffffffff868;
              other_04.m_size = (qsizetype)in_stack_fffffffffffff860;
              other_04.m_data._7_1_ = in_stack_fffffffffffff86f;
              iVar2 = QStringView::compare
                                ((QStringView *)in_stack_fffffffffffff838,other_04,CaseInsensitive);
              QString::~QString((QString *)0x19bb3d);
              if (iVar2 == 0) {
                this_00 = (DomWidget *)operator_new(0x160);
                memset(this_00,0,0x160);
                DomWidget::DomWidget(in_stack_fffffffffffff840);
                DomWidget::read(this_00,__fd,__buf_00,sVar3);
                setElementWidget(in_stack_fffffffffffff850,
                                 (DomWidget *)
                                 CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
              }
              else {
                Qt::Literals::StringLiterals::operator____s
                          ((char16_t *)CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858)
                           ,(size_t)in_stack_fffffffffffff850);
                QStringView::QStringView<QString,_true>
                          ((QStringView *)in_stack_fffffffffffff850,
                           (QString *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848))
                ;
                sVar3 = 0;
                other_05.m_data._0_7_ = in_stack_fffffffffffff868;
                other_05.m_size = (qsizetype)in_stack_fffffffffffff860;
                other_05.m_data._7_1_ = in_stack_fffffffffffff86f;
                iVar2 = QStringView::compare
                                  ((QStringView *)in_stack_fffffffffffff838,other_05,CaseInsensitive
                                  );
                QString::~QString((QString *)0x19bc20);
                if (iVar2 == 0) {
                  this_01 = (DomLayoutDefault *)operator_new(0x10);
                  memset(this_01,0,0x10);
                  DomLayoutDefault::DomLayoutDefault(this_01);
                  DomLayoutDefault::read(this_01,__fd,__buf_01,sVar3);
                  setElementLayoutDefault
                            (in_stack_fffffffffffff850,
                             (DomLayoutDefault *)
                             CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
                }
                else {
                  Qt::Literals::StringLiterals::operator____s
                            ((char16_t *)
                             CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                             (size_t)in_stack_fffffffffffff850);
                  QStringView::QStringView<QString,_true>
                            ((QStringView *)in_stack_fffffffffffff850,
                             (QString *)
                             CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
                  sVar3 = 0;
                  other_06.m_data._0_7_ = in_stack_fffffffffffff868;
                  other_06.m_size = (qsizetype)in_stack_fffffffffffff860;
                  other_06.m_data._7_1_ = in_stack_fffffffffffff86f;
                  iVar2 = QStringView::compare
                                    ((QStringView *)in_stack_fffffffffffff838,other_06,
                                     CaseInsensitive);
                  QString::~QString((QString *)0x19bd03);
                  if (iVar2 == 0) {
                    this_02 = (DomLayoutFunction *)operator_new(0x40);
                    memset(this_02,0,0x40);
                    DomLayoutFunction::DomLayoutFunction
                              ((DomLayoutFunction *)in_stack_fffffffffffff840);
                    DomLayoutFunction::read(this_02,__fd,__buf_02,sVar3);
                    setElementLayoutFunction
                              (in_stack_fffffffffffff850,
                               (DomLayoutFunction *)
                               CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
                  }
                  else {
                    Qt::Literals::StringLiterals::operator____s
                              ((char16_t *)
                               CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                               (size_t)in_stack_fffffffffffff850);
                    QStringView::QStringView<QString,_true>
                              ((QStringView *)in_stack_fffffffffffff850,
                               (QString *)
                               CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
                    other_07.m_data._0_7_ = in_stack_fffffffffffff868;
                    other_07.m_size = (qsizetype)in_stack_fffffffffffff860;
                    other_07.m_data._7_1_ = in_stack_fffffffffffff86f;
                    iVar2 = QStringView::compare
                                      ((QStringView *)in_stack_fffffffffffff838,other_07,
                                       CaseInsensitive);
                    QString::~QString((QString *)0x19bde6);
                    if (iVar2 == 0) {
                      QXmlStreamReader::readElementText(local_498,pQVar4,0);
                      setElementPixmapFunction
                                ((DomUI *)in_stack_fffffffffffff840,
                                 (QString *)in_stack_fffffffffffff838);
                      QString::~QString((QString *)0x19be2c);
                    }
                    else {
                      Qt::Literals::StringLiterals::operator____s
                                ((char16_t *)
                                 CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                                 (size_t)in_stack_fffffffffffff850);
                      QStringView::QStringView<QString,_true>
                                ((QStringView *)in_stack_fffffffffffff850,
                                 (QString *)
                                 CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
                      sVar3 = 0;
                      other_08.m_data._0_7_ = in_stack_fffffffffffff868;
                      other_08.m_size = (qsizetype)in_stack_fffffffffffff860;
                      other_08.m_data._7_1_ = in_stack_fffffffffffff86f;
                      iVar2 = QStringView::compare
                                        ((QStringView *)in_stack_fffffffffffff838,other_08,
                                         CaseInsensitive);
                      QString::~QString((QString *)0x19be9a);
                      if (iVar2 == 0) {
                        this_03 = (DomCustomWidgets *)operator_new(0x20);
                        memset(this_03,0,0x20);
                        DomCustomWidgets::DomCustomWidgets((DomCustomWidgets *)0x19becf);
                        DomCustomWidgets::read(this_03,__fd,__buf_03,sVar3);
                        setElementCustomWidgets
                                  (in_stack_fffffffffffff850,
                                   (DomCustomWidgets *)
                                   CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
                      }
                      else {
                        Qt::Literals::StringLiterals::operator____s
                                  ((char16_t *)
                                   CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                                   (size_t)in_stack_fffffffffffff850);
                        QStringView::QStringView<QString,_true>
                                  ((QStringView *)in_stack_fffffffffffff850,
                                   (QString *)
                                   CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
                        sVar3 = 0;
                        other_09.m_data._0_7_ = in_stack_fffffffffffff868;
                        other_09.m_size = (qsizetype)in_stack_fffffffffffff860;
                        other_09.m_data._7_1_ = in_stack_fffffffffffff86f;
                        iVar2 = QStringView::compare
                                          ((QStringView *)in_stack_fffffffffffff838,other_09,
                                           CaseInsensitive);
                        QString::~QString((QString *)0x19bf71);
                        if (iVar2 == 0) {
                          this_04 = (DomTabStops *)operator_new(0x20);
                          memset(this_04,0,0x20);
                          DomTabStops::DomTabStops((DomTabStops *)0x19bfa3);
                          DomTabStops::read(this_04,__fd,__buf_04,sVar3);
                          setElementTabStops(in_stack_fffffffffffff850,
                                             (DomTabStops *)
                                             CONCAT17(in_stack_fffffffffffff84f,
                                                      in_stack_fffffffffffff848));
                        }
                        else {
                          Qt::Literals::StringLiterals::operator____s
                                    ((char16_t *)
                                     CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858),
                                     (size_t)in_stack_fffffffffffff850);
                          QStringView::QStringView<QString,_true>
                                    ((QStringView *)in_stack_fffffffffffff850,
                                     (QString *)
                                     CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
                          other_10.m_data._0_7_ = in_stack_fffffffffffff868;
                          other_10.m_size = (qsizetype)in_stack_fffffffffffff860;
                          other_10.m_data._7_1_ = in_stack_fffffffffffff86f;
                          iVar2 = QStringView::compare
                                            ((QStringView *)in_stack_fffffffffffff838,other_10,
                                             CaseInsensitive);
                          QString::~QString((QString *)0x19c045);
                          if (iVar2 == 0) {
                            QMessageLogger::QMessageLogger
                                      ((QMessageLogger *)in_stack_fffffffffffff850,
                                       (char *)CONCAT17(in_stack_fffffffffffff84f,
                                                        in_stack_fffffffffffff848),
                                       (int)((ulong)in_stack_fffffffffffff840 >> 0x20),
                                       (char *)in_stack_fffffffffffff838);
                            QMessageLogger::warning
                                      (local_530,"Omitting deprecated element <images>.");
                            QXmlStreamReader::skipCurrentElement();
                          }
                          else {
                            Qt::Literals::StringLiterals::operator____s
                                      ((char16_t *)
                                       CONCAT17(in_stack_fffffffffffff85f,in_stack_fffffffffffff858)
                                       ,(size_t)in_stack_fffffffffffff850);
                            QStringView::QStringView<QString,_true>
                                      ((QStringView *)in_stack_fffffffffffff850,
                                       (QString *)
                                       CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848)
                                      );
                            sVar3 = 0;
                            other_11.m_data._0_7_ = in_stack_fffffffffffff868;
                            other_11.m_size = (qsizetype)in_stack_fffffffffffff860;
                            other_11.m_data._7_1_ = in_stack_fffffffffffff86f;
                            iVar2 = QStringView::compare
                                              ((QStringView *)in_stack_fffffffffffff838,other_11,
                                               CaseInsensitive);
                            QString::~QString((QString *)0x19c0f3);
                            if (iVar2 == 0) {
                              this_05 = (DomIncludes *)operator_new(0x20);
                              memset(this_05,0,0x20);
                              DomIncludes::DomIncludes((DomIncludes *)0x19c125);
                              DomIncludes::read(this_05,__fd,__buf_05,sVar3);
                              setElementIncludes(in_stack_fffffffffffff850,
                                                 (DomIncludes *)
                                                 CONCAT17(in_stack_fffffffffffff84f,
                                                          in_stack_fffffffffffff848));
                            }
                            else {
                              Qt::Literals::StringLiterals::operator____s
                                        ((char16_t *)
                                         CONCAT17(in_stack_fffffffffffff85f,
                                                  in_stack_fffffffffffff858),
                                         (size_t)in_stack_fffffffffffff850);
                              QStringView::QStringView<QString,_true>
                                        ((QStringView *)in_stack_fffffffffffff850,
                                         (QString *)
                                         CONCAT17(in_stack_fffffffffffff84f,
                                                  in_stack_fffffffffffff848));
                              sVar3 = 0;
                              other_12.m_data._0_7_ = in_stack_fffffffffffff868;
                              other_12.m_size = (qsizetype)in_stack_fffffffffffff860;
                              other_12.m_data._7_1_ = in_stack_fffffffffffff86f;
                              iVar2 = QStringView::compare
                                                ((QStringView *)in_stack_fffffffffffff838,other_12,
                                                 CaseInsensitive);
                              QString::~QString((QString *)0x19c1c7);
                              if (iVar2 == 0) {
                                this_06 = (DomResources *)operator_new(0x38);
                                memset(this_06,0,0x38);
                                DomResources::DomResources
                                          ((DomResources *)in_stack_fffffffffffff840);
                                DomResources::read(this_06,__fd,__buf_06,sVar3);
                                setElementResources(in_stack_fffffffffffff850,
                                                    (DomResources *)
                                                    CONCAT17(in_stack_fffffffffffff84f,
                                                             in_stack_fffffffffffff848));
                              }
                              else {
                                Qt::Literals::StringLiterals::operator____s
                                          ((char16_t *)
                                           CONCAT17(in_stack_fffffffffffff85f,
                                                    in_stack_fffffffffffff858),
                                           (size_t)in_stack_fffffffffffff850);
                                QStringView::QStringView<QString,_true>
                                          ((QStringView *)in_stack_fffffffffffff850,
                                           (QString *)
                                           CONCAT17(in_stack_fffffffffffff84f,
                                                    in_stack_fffffffffffff848));
                                sVar3 = 0;
                                other_13.m_data._0_7_ = in_stack_fffffffffffff868;
                                other_13.m_size = (qsizetype)in_stack_fffffffffffff860;
                                other_13.m_data._7_1_ = in_stack_fffffffffffff86f;
                                iVar2 = QStringView::compare
                                                  ((QStringView *)in_stack_fffffffffffff838,other_13
                                                   ,CaseInsensitive);
                                QString::~QString((QString *)0x19c29b);
                                if (iVar2 == 0) {
                                  this_07 = (DomConnections *)operator_new(0x20);
                                  memset(this_07,0,0x20);
                                  DomConnections::DomConnections((DomConnections *)0x19c2cd);
                                  DomConnections::read(this_07,__fd,__buf_07,sVar3);
                                  setElementConnections
                                            (in_stack_fffffffffffff850,
                                             (DomConnections *)
                                             CONCAT17(in_stack_fffffffffffff84f,
                                                      in_stack_fffffffffffff848));
                                }
                                else {
                                  Qt::Literals::StringLiterals::operator____s
                                            ((char16_t *)
                                             CONCAT17(in_stack_fffffffffffff85f,
                                                      in_stack_fffffffffffff858),
                                             (size_t)in_stack_fffffffffffff850);
                                  QStringView::QStringView<QString,_true>
                                            ((QStringView *)in_stack_fffffffffffff850,
                                             (QString *)
                                             CONCAT17(in_stack_fffffffffffff84f,
                                                      in_stack_fffffffffffff848));
                                  sVar3 = 0;
                                  other_14.m_data._0_7_ = in_stack_fffffffffffff868;
                                  other_14.m_size = (qsizetype)in_stack_fffffffffffff860;
                                  other_14.m_data._7_1_ = in_stack_fffffffffffff86f;
                                  iVar2 = QStringView::compare
                                                    ((QStringView *)in_stack_fffffffffffff838,
                                                     other_14,CaseInsensitive);
                                  in_stack_fffffffffffff86f = iVar2 != 0 ^ 0xff;
                                  QString::~QString((QString *)0x19c36f);
                                  if ((in_stack_fffffffffffff86f & 1) == 0) {
                                    Qt::Literals::StringLiterals::operator____s
                                              ((char16_t *)
                                               CONCAT17(in_stack_fffffffffffff85f,
                                                        in_stack_fffffffffffff858),
                                               (size_t)in_stack_fffffffffffff850);
                                    QStringView::QStringView<QString,_true>
                                              ((QStringView *)in_stack_fffffffffffff850,
                                               (QString *)
                                               CONCAT17(in_stack_fffffffffffff84f,
                                                        in_stack_fffffffffffff848));
                                    sVar3 = 0;
                                    other_15.m_data._0_7_ = in_stack_fffffffffffff868;
                                    other_15.m_size = (qsizetype)in_stack_fffffffffffff860;
                                    other_15.m_data._7_1_ = in_stack_fffffffffffff86f;
                                    iVar2 = QStringView::compare
                                                      ((QStringView *)in_stack_fffffffffffff838,
                                                       other_15,CaseInsensitive);
                                    in_stack_fffffffffffff85f = iVar2 != 0 ^ 0xff;
                                    QString::~QString((QString *)0x19c443);
                                    if ((in_stack_fffffffffffff85f & 1) == 0) {
                                      Qt::Literals::StringLiterals::operator____s
                                                ((char16_t *)
                                                 CONCAT17(in_stack_fffffffffffff85f,
                                                          in_stack_fffffffffffff858),
                                                 (size_t)in_stack_fffffffffffff850);
                                      QStringView::QStringView<QString,_true>
                                                ((QStringView *)in_stack_fffffffffffff850,
                                                 (QString *)
                                                 CONCAT17(in_stack_fffffffffffff84f,
                                                          in_stack_fffffffffffff848));
                                      sVar3 = 0;
                                      other_16.m_data._0_7_ = in_stack_fffffffffffff868;
                                      other_16.m_size = (qsizetype)in_stack_fffffffffffff860;
                                      other_16.m_data._7_1_ = in_stack_fffffffffffff86f;
                                      iVar2 = QStringView::compare
                                                        ((QStringView *)in_stack_fffffffffffff838,
                                                         other_16,CaseInsensitive);
                                      in_stack_fffffffffffff84f = iVar2 != 0 ^ 0xff;
                                      QString::~QString((QString *)0x19c517);
                                      if ((in_stack_fffffffffffff84f & 1) == 0) {
                                        in_stack_fffffffffffff838 = pQVar4;
                                        Qt::Literals::StringLiterals::operator____L1
                                                  ((char *)CONCAT17(in_stack_fffffffffffff84f,
                                                                    in_stack_fffffffffffff848),
                                                   (size_t)in_stack_fffffffffffff840);
                                        ::operator+((QLatin1String *)in_stack_fffffffffffff840,
                                                    (QStringView *)in_stack_fffffffffffff838);
                                        ::QStringBuilder::operator_cast_to_QString
                                                  (in_stack_fffffffffffff838);
                                        QXmlStreamReader::raiseError
                                                  ((QString *)in_stack_fffffffffffff838);
                                        QString::~QString((QString *)0x19c602);
                                      }
                                      else {
                                        in_stack_fffffffffffff840 = (DomWidget *)operator_new(0x20);
                                        memset(in_stack_fffffffffffff840,0,0x20);
                                        DomButtonGroups::DomButtonGroups
                                                  ((DomButtonGroups *)0x19c549);
                                        DomButtonGroups::read
                                                  ((DomButtonGroups *)in_stack_fffffffffffff840,__fd
                                                   ,__buf_10,sVar3);
                                        setElementButtonGroups
                                                  (in_stack_fffffffffffff850,
                                                   (DomButtonGroups *)
                                                   CONCAT17(in_stack_fffffffffffff84f,
                                                            in_stack_fffffffffffff848));
                                      }
                                    }
                                    else {
                                      in_stack_fffffffffffff850 = (DomUI *)operator_new(0x38);
                                      memset(in_stack_fffffffffffff850,0,0x38);
                                      DomSlots::DomSlots((DomSlots *)in_stack_fffffffffffff840);
                                      DomSlots::read((DomSlots *)in_stack_fffffffffffff850,__fd,
                                                     __buf_09,sVar3);
                                      setElementSlots(in_stack_fffffffffffff850,
                                                      (DomSlots *)
                                                      CONCAT17(in_stack_fffffffffffff84f,
                                                               in_stack_fffffffffffff848));
                                    }
                                  }
                                  else {
                                    in_stack_fffffffffffff860 =
                                         (DomDesignerData *)operator_new(0x20);
                                    memset(in_stack_fffffffffffff860,0,0x20);
                                    DomDesignerData::DomDesignerData((DomDesignerData *)0x19c3a1);
                                    DomDesignerData::read
                                              (in_stack_fffffffffffff860,__fd,__buf_08,sVar3);
                                    setElementDesignerdata
                                              (in_stack_fffffffffffff850,
                                               (DomDesignerData *)
                                               CONCAT17(in_stack_fffffffffffff84f,
                                                        in_stack_fffffffffffff848));
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  } while (iVar2 != 5);
LAB_0019c623:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x19c630);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomUI::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"version"_s) {
            setAttributeVersion(attribute.value().toString());
            continue;
        }
        if (name == u"language"_s) {
            setAttributeLanguage(attribute.value().toString());
            continue;
        }
        if (name == u"displayname"_s) {
            setAttributeDisplayname(attribute.value().toString());
            continue;
        }
        if (name == u"idbasedtr"_s) {
            setAttributeIdbasedtr(attribute.value() == u"true"_s);
            continue;
        }
        if (name == u"connectslotsbyname"_s) {
            setAttributeConnectslotsbyname(attribute.value() == u"true"_s);
            continue;
        }
        if (name == u"stdsetdef"_s) {
            setAttributeStdsetdef(attribute.value().toInt());
            continue;
        }
        if (name == u"stdSetDef"_s) {
            setAttributeStdSetDef(attribute.value().toInt());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"author"_s, Qt::CaseInsensitive)) {
                setElementAuthor(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"comment"_s, Qt::CaseInsensitive)
                    || !tag.compare(u"legal"_s, Qt::CaseInsensitive)) {
                setElementComment(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"exportmacro"_s, Qt::CaseInsensitive)) {
                setElementExportMacro(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"class"_s, Qt::CaseInsensitive)) {
                setElementClass(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"widget"_s, Qt::CaseInsensitive)) {
                auto *v = new DomWidget();
                v->read(reader);
                setElementWidget(v);
                continue;
            }
            if (!tag.compare(u"layoutdefault"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLayoutDefault();
                v->read(reader);
                setElementLayoutDefault(v);
                continue;
            }
            if (!tag.compare(u"layoutfunction"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLayoutFunction();
                v->read(reader);
                setElementLayoutFunction(v);
                continue;
            }
            if (!tag.compare(u"pixmapfunction"_s, Qt::CaseInsensitive)) {
                setElementPixmapFunction(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"customwidgets"_s, Qt::CaseInsensitive)) {
                auto *v = new DomCustomWidgets();
                v->read(reader);
                setElementCustomWidgets(v);
                continue;
            }
            if (!tag.compare(u"tabstops"_s, Qt::CaseInsensitive)) {
                auto *v = new DomTabStops();
                v->read(reader);
                setElementTabStops(v);
                continue;
            }
            if (!tag.compare(u"images"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <images>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"includes"_s, Qt::CaseInsensitive)) {
                auto *v = new DomIncludes();
                v->read(reader);
                setElementIncludes(v);
                continue;
            }
            if (!tag.compare(u"resources"_s, Qt::CaseInsensitive)) {
                auto *v = new DomResources();
                v->read(reader);
                setElementResources(v);
                continue;
            }
            if (!tag.compare(u"connections"_s, Qt::CaseInsensitive)) {
                auto *v = new DomConnections();
                v->read(reader);
                setElementConnections(v);
                continue;
            }
            if (!tag.compare(u"designerdata"_s, Qt::CaseInsensitive)) {
                auto *v = new DomDesignerData();
                v->read(reader);
                setElementDesignerdata(v);
                continue;
            }
            if (!tag.compare(u"slots"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSlots();
                v->read(reader);
                setElementSlots(v);
                continue;
            }
            if (!tag.compare(u"buttongroups"_s, Qt::CaseInsensitive)) {
                auto *v = new DomButtonGroups();
                v->read(reader);
                setElementButtonGroups(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}